

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
::clear(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
        *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (uVar1 < 0x80) {
      if (uVar1 != 0) {
        lVar2 = 0x10;
        uVar3 = 0;
        do {
          if ((-1 < this->ctrl_[uVar3]) &&
             (this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)this->slots_ + lVar2),
             this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            uVar1 = this->capacity_;
          }
          uVar3 = uVar3 + 1;
          lVar2 = lVar2 + 0x18;
        } while (uVar3 != uVar1);
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar1 + 0x10);
        this->ctrl_[this->capacity_] = -1;
        reset_growth_left(this);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x4c3,
                    "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::clear() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const { return !size(); }